

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O3

void __thiscall XInputSimulatorImplLinux::XInputSimulatorImplLinux(XInputSimulatorImplLinux *this)

{
  long lVar1;
  int __fd;
  Display *pDVar2;
  long lVar3;
  undefined5 local_470;
  undefined3 uStack_46b;
  undefined5 uStack_468;
  undefined1 local_463 [67];
  undefined8 local_420;
  undefined8 local_414;
  
  XInputSimulatorImpl::XInputSimulatorImpl(&this->super_XInputSimulatorImpl);
  (this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl =
       (_func_int **)&PTR__XInputSimulatorImpl_0010bce0;
  pDVar2 = (Display *)XOpenDisplay(0);
  this->display = pDVar2;
  if (pDVar2 != (Display *)0x0) {
    lVar1 = *(long *)(pDVar2 + 0xe8);
    lVar3 = (long)*(int *)(pDVar2 + 0xe0) * 0x80;
    this->root = *(Window *)(lVar1 + 0x10 + lVar3);
    this->displayX = (long)*(int *)(lVar1 + 0x18 + lVar3);
    this->displayY = (long)*(int *)(lVar1 + 0x1c + lVar3);
    __fd = open("/dev/uinput",0x801);
    this->fd = __fd;
    ioctl(__fd,0x40045564,1);
    ioctl(this->fd,0x40045565,0x111);
    ioctl(this->fd,0x40045565,0x110);
    ioctl(this->fd,0x40045564,3);
    ioctl(this->fd,0x40045567,0);
    ioctl(this->fd,0x40045567,1);
    ioctl(this->fd,0x40045564,2);
    memset(local_463,0,0x44f);
    local_470 = 0x7574726956;
    uStack_46b = 0x4d6c61;
    uStack_468 = 0x6573756f;
    local_420 = 0x1000100010003;
    local_414 = CONCAT44((int)this->displayY,(int)this->displayX);
    write(this->fd,&local_470,0x45c);
    ioctl(this->fd,0x5501);
    sleep(1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"can not access display server!",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return;
}

Assistant:

XInputSimulatorImplLinux::XInputSimulatorImplLinux()
{
    if((display = XOpenDisplay(NULL)) == NULL) {
        std::cout << "can not access display server!" << std::endl;
            return;
    }

    root = DefaultRootWindow(display);

    Screen* pscr = DefaultScreenOfDisplay( display );

    this->displayX = pscr->width;
    this->displayY = pscr->height;

   fd = open("/dev/uinput", O_WRONLY | O_NONBLOCK);
   ioctl(fd, UI_SET_EVBIT, EV_KEY);
   ioctl(fd, UI_SET_KEYBIT, BTN_RIGHT);
   ioctl(fd, UI_SET_KEYBIT, BTN_LEFT);
   ioctl(fd, UI_SET_EVBIT, EV_ABS);
   ioctl(fd, UI_SET_ABSBIT, ABS_X);
   ioctl(fd, UI_SET_ABSBIT, ABS_Y);
   ioctl(fd, UI_SET_EVBIT, EV_REL);

   struct uinput_user_dev uidev;
   memset(&uidev,0,sizeof(uidev));
   snprintf(uidev.name,UINPUT_MAX_NAME_SIZE,"VirtualMouse");
   uidev.id.bustype = BUS_USB;
   uidev.id.version = 1;
   uidev.id.vendor = 0x1;
   uidev.id.product = 0x1;
   uidev.absmin[ABS_X] = 0;
   uidev.absmax[ABS_X] = displayX;
   uidev.absmin[ABS_Y] = 0;
   uidev.absmax[ABS_Y] = displayY;

   write(fd, &uidev, sizeof(uidev));
   ioctl(fd, UI_DEV_CREATE);

   sleep(1);
}